

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::NotImplementedException::NotImplementedException
          (NotImplementedException *this,SourceLineInfo *lineInfo)

{
  pointer pcVar1;
  ostringstream oss;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__NotImplementedException_0016cb00;
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  (this->m_what)._M_string_length = 0;
  (this->m_what).field_2._M_local_buf[0] = '\0';
  (this->m_lineInfo).file._M_dataplus._M_p = (pointer)&(this->m_lineInfo).file.field_2;
  pcVar1 = (lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_lineInfo,pcVar1,pcVar1 + (lineInfo->file)._M_string_length);
  (this->m_lineInfo).line = lineInfo->line;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  operator<<((ostream *)local_1a8,lineInfo);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": function ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"not implemented",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_what,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

NotImplementedException::NotImplementedException( SourceLineInfo const& lineInfo )
    :   m_lineInfo( lineInfo ) {
        std::ostringstream oss;
        oss << lineInfo << ": function ";
        oss << "not implemented";
        m_what = oss.str();
    }